

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper_avx2.cpp
# Opt level: O3

void storeRGBX16FFromRGBA32F_avx2
               (uchar *dest,QRgbaFloat32 *src,int index,int count,QList<unsigned_int> *param_5,
               QDitherInfo *param_6)

{
  float fVar1;
  undefined1 auVar2 [16];
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  long lVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  
  if (0 < count) {
    lVar7 = 0;
    do {
      auVar2 = *(undefined1 (*) [16])((long)&src->r + lVar7 * 2);
      fVar1 = *(float *)((long)&src->a + lVar7 * 2);
      auVar9._4_4_ = fVar1;
      auVar9._0_4_ = fVar1;
      auVar9._8_4_ = fVar1;
      auVar9._12_4_ = fVar1;
      if (((fVar1 != 1.0) || (auVar8 = auVar2, NAN(fVar1))) &&
         ((fVar1 != 0.0 || (auVar8 = _DAT_0068fad0, NAN(fVar1))))) {
        auVar9 = vrcpps_avx(auVar9);
        fVar3 = auVar9._0_4_;
        auVar11._0_4_ = fVar3 + fVar3;
        fVar4 = auVar9._4_4_;
        auVar11._4_4_ = fVar4 + fVar4;
        fVar5 = auVar9._8_4_;
        auVar11._8_4_ = fVar5 + fVar5;
        fVar6 = auVar9._12_4_;
        auVar11._12_4_ = fVar6 + fVar6;
        auVar10._0_4_ = fVar3 * fVar1 * fVar3;
        auVar10._4_4_ = fVar4 * fVar1 * fVar4;
        auVar10._8_4_ = fVar5 * fVar1 * fVar5;
        auVar10._12_4_ = fVar6 * fVar1 * fVar6;
        auVar9 = vsubps_avx(auVar11,auVar10);
        auVar8._0_4_ = auVar2._0_4_ * auVar9._0_4_;
        auVar8._4_4_ = auVar2._4_4_ * auVar9._4_4_;
        auVar8._8_4_ = auVar2._8_4_ * auVar9._8_4_;
        auVar8._12_4_ = auVar2._12_4_ * auVar9._12_4_;
        auVar8 = vinsertps_avx(auVar8,ZEXT416(0x3f800000),0x30);
      }
      vcvtps2ph_f16c(auVar8,0);
      lVar7 = lVar7 + 8;
    } while ((ulong)(uint)count << 3 != lVar7);
  }
  return;
}

Assistant:

void QT_FASTCALL storeRGBX16FFromRGBA32F_avx2(uchar *dest, const QRgbaFloat32 *src, int index, int count,
                                              const QList<QRgb> *, QDitherInfo *)
{
    quint64 *d = reinterpret_cast<quint64 *>(dest) + index;
    const __m128 *s = reinterpret_cast<const __m128 *>(src);
    const __m128 zero = _mm_set_ps(1.0f, 0.0f, 0.0f, 0.0f);
    for (int i = 0; i < count; ++i) {
        __m128 vsf = _mm_loadu_ps(reinterpret_cast<const float *>(s + i));
        const __m128 vsa = _mm_permute_ps(vsf, _MM_SHUFFLE(3, 3, 3, 3));
        const float a = _mm_cvtss_f32(vsa);
        if (a == 1.0f)
        { }
        else if (a == 0.0f)
            vsf = zero;
        else {
            __m128 vsr = _mm_rcp_ps(vsa);
            vsr = _mm_sub_ps(_mm_add_ps(vsr, vsr), _mm_mul_ps(vsr, _mm_mul_ps(vsr, vsa)));
            vsf = _mm_mul_ps(vsf, vsr);
            vsf = _mm_insert_ps(vsf, _mm_set_ss(1.0f), 0x30);
        }
        _mm_storel_epi64((__m128i *)(d + i), _mm_cvtps_ph(vsf, 0));
    }
}